

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O1

void __thiscall
JsUtil::
BaseDictionary<Js::CaseInvariantPropertyListWithHashCode_*,_Js::CaseInvariantPropertyListWithHashCode_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_JsUtil::NoCaseComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
::RemoveAt(BaseDictionary<Js::CaseInvariantPropertyListWithHashCode_*,_Js::CaseInvariantPropertyListWithHashCode_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_JsUtil::NoCaseComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
           *this,int i,int last,uint targetBucket)

{
  int iVar1;
  SimpleDictionaryEntry<Memory::WriteBarrierPtr<Js::CaseInvariantPropertyListWithHashCode>,_Memory::WriteBarrierPtr<Js::CaseInvariantPropertyListWithHashCode>_>
  *pSVar2;
  SimpleDictionaryEntry<Memory::WriteBarrierPtr<Js::CaseInvariantPropertyListWithHashCode>,_Memory::WriteBarrierPtr<Js::CaseInvariantPropertyListWithHashCode>_>
  *pSVar3;
  WriteBarrierPtr<Js::CaseInvariantPropertyListWithHashCode> *addr;
  
  pSVar2 = (this->entries).ptr;
  iVar1 = pSVar2[i].
          super_DefaultHashedEntry<Memory::WriteBarrierPtr<Js::CaseInvariantPropertyListWithHashCode>,_Memory::WriteBarrierPtr<Js::CaseInvariantPropertyListWithHashCode>,_JsUtil::(anonymous_namespace)::KeyValueEntry>
          .
          super_KeyValueEntry<Memory::WriteBarrierPtr<Js::CaseInvariantPropertyListWithHashCode>,_Memory::WriteBarrierPtr<Js::CaseInvariantPropertyListWithHashCode>_>
          .
          super_ValueEntry<Memory::WriteBarrierPtr<Js::CaseInvariantPropertyListWithHashCode>,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<Memory::WriteBarrierPtr<Js::CaseInvariantPropertyListWithHashCode>,_Memory::WriteBarrierPtr<Js::CaseInvariantPropertyListWithHashCode>_>_>
          .
          super_KeyValueEntryDataLayout2<Memory::WriteBarrierPtr<Js::CaseInvariantPropertyListWithHashCode>,_Memory::WriteBarrierPtr<Js::CaseInvariantPropertyListWithHashCode>_>
          .next;
  if (last < 0) {
    (this->buckets).ptr[targetBucket] = iVar1;
  }
  else {
    pSVar2[(uint)last].
    super_DefaultHashedEntry<Memory::WriteBarrierPtr<Js::CaseInvariantPropertyListWithHashCode>,_Memory::WriteBarrierPtr<Js::CaseInvariantPropertyListWithHashCode>,_JsUtil::(anonymous_namespace)::KeyValueEntry>
    .
    super_KeyValueEntry<Memory::WriteBarrierPtr<Js::CaseInvariantPropertyListWithHashCode>,_Memory::WriteBarrierPtr<Js::CaseInvariantPropertyListWithHashCode>_>
    .
    super_ValueEntry<Memory::WriteBarrierPtr<Js::CaseInvariantPropertyListWithHashCode>,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<Memory::WriteBarrierPtr<Js::CaseInvariantPropertyListWithHashCode>,_Memory::WriteBarrierPtr<Js::CaseInvariantPropertyListWithHashCode>_>_>
    .
    super_KeyValueEntryDataLayout2<Memory::WriteBarrierPtr<Js::CaseInvariantPropertyListWithHashCode>,_Memory::WriteBarrierPtr<Js::CaseInvariantPropertyListWithHashCode>_>
    .next = iVar1;
  }
  pSVar3 = (this->entries).ptr;
  pSVar2 = pSVar3 + i;
  Memory::Recycler::WBSetBit((char *)pSVar2);
  pSVar3 = pSVar3 + i;
  addr = &(pSVar3->
          super_DefaultHashedEntry<Memory::WriteBarrierPtr<Js::CaseInvariantPropertyListWithHashCode>,_Memory::WriteBarrierPtr<Js::CaseInvariantPropertyListWithHashCode>,_JsUtil::(anonymous_namespace)::KeyValueEntry>
          ).
          super_KeyValueEntry<Memory::WriteBarrierPtr<Js::CaseInvariantPropertyListWithHashCode>,_Memory::WriteBarrierPtr<Js::CaseInvariantPropertyListWithHashCode>_>
          .
          super_ValueEntry<Memory::WriteBarrierPtr<Js::CaseInvariantPropertyListWithHashCode>,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<Memory::WriteBarrierPtr<Js::CaseInvariantPropertyListWithHashCode>,_Memory::WriteBarrierPtr<Js::CaseInvariantPropertyListWithHashCode>_>_>
          .
          super_KeyValueEntryDataLayout2<Memory::WriteBarrierPtr<Js::CaseInvariantPropertyListWithHashCode>,_Memory::WriteBarrierPtr<Js::CaseInvariantPropertyListWithHashCode>_>
          .key;
  (pSVar3->
  super_DefaultHashedEntry<Memory::WriteBarrierPtr<Js::CaseInvariantPropertyListWithHashCode>,_Memory::WriteBarrierPtr<Js::CaseInvariantPropertyListWithHashCode>,_JsUtil::(anonymous_namespace)::KeyValueEntry>
  ).
  super_KeyValueEntry<Memory::WriteBarrierPtr<Js::CaseInvariantPropertyListWithHashCode>,_Memory::WriteBarrierPtr<Js::CaseInvariantPropertyListWithHashCode>_>
  .
  super_ValueEntry<Memory::WriteBarrierPtr<Js::CaseInvariantPropertyListWithHashCode>,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<Memory::WriteBarrierPtr<Js::CaseInvariantPropertyListWithHashCode>,_Memory::WriteBarrierPtr<Js::CaseInvariantPropertyListWithHashCode>_>_>
  .
  super_KeyValueEntryDataLayout2<Memory::WriteBarrierPtr<Js::CaseInvariantPropertyListWithHashCode>,_Memory::WriteBarrierPtr<Js::CaseInvariantPropertyListWithHashCode>_>
  .value.ptr = (CaseInvariantPropertyListWithHashCode *)0x0;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(pSVar2);
  Memory::Recycler::WBSetBit((char *)addr);
  addr->ptr = (CaseInvariantPropertyListWithHashCode *)0x0;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
  SetNextFreeEntryIndex(this,(this->entries).ptr + i,-(uint)(this->freeCount == 0) | this->freeList)
  ;
  this->freeList = i;
  this->freeCount = this->freeCount + 1;
  if (this->stats != (DictionaryStats *)0x0) {
    DictionaryStats::Remove(this->stats,(this->buckets).ptr[targetBucket] == -1);
    return;
  }
  return;
}

Assistant:

inline void RemoveAt(const int i, const int last, const uint targetBucket)
        {
            if (last < 0)
            {
                buckets[targetBucket] = entries[i].next;
            }
            else
            {
                entries[last].next = entries[i].next;
            }
            entries[i].Clear();
            SetNextFreeEntryIndex(entries[i], freeCount == 0 ? -1 : freeList);
            freeList = i;
            freeCount++;
#if PROFILE_DICTIONARY
            if (stats)
                stats->Remove(buckets[targetBucket] == -1);
#endif
        }